

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O3

int query_objlist(char *qstr,obj *olist,int qflags,object_pick **pick_list,int how,
                 _func_boolean_obj_ptr *allow)

{
  int iVar1;
  long lVar2;
  undefined8 *__ptr;
  boolean bVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  nh_objresult *pick_list_00;
  object_pick *poVar8;
  int iVar9;
  code *__compar;
  ulong uVar10;
  undefined4 in_register_00000014;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  obj *poVar15;
  uint uVar16;
  obj *poVar17;
  bool bVar18;
  int nr_items;
  ulong local_70;
  undefined8 local_68;
  undefined8 *local_60;
  nh_objitem *local_58;
  undefined8 local_50;
  int local_44;
  object_pick **local_40;
  char *local_38;
  
  local_70 = CONCAT44(in_register_00000014,qflags);
  nr_items = 0;
  poVar17 = (obj *)0x0;
  *pick_list = (object_pick *)0x0;
  local_68 = CONCAT44(local_68._4_4_,qflags) & 0xffffffff00000080;
  uVar11 = (qflags & 0x80U) >> 7;
  if (uVar11 != 0) {
    poVar17 = &zeroobj;
  }
  local_44 = how;
  local_40 = pick_list;
  local_38 = qstr;
  if (olist != (obj *)0x0) {
    poVar15 = olist;
    do {
      bVar3 = (*allow)(poVar15);
      if (bVar3 != '\0') {
        poVar17 = poVar15;
      }
      uVar11 = uVar11 + (bVar3 != '\0');
      poVar15 = *(obj **)((long)poVar15->oextra + ((ulong)(qflags * 8 & 8) - 100));
    } while (poVar15 != (obj *)0x0);
  }
  if (uVar11 == 1) {
    if ((local_70 & 2) != 0) {
      poVar8 = (object_pick *)malloc(0x10);
      *local_40 = poVar8;
      poVar8->obj = poVar17;
      iVar9 = 1;
      if (poVar17 != &zeroobj) {
        iVar9 = poVar17->quan;
      }
      poVar8->count = iVar9;
      return 1;
    }
  }
  else if (uVar11 == 0) {
    return ((int)local_70 << 0x1b) >> 0x1f;
  }
  local_60 = (undefined8 *)malloc((ulong)uVar11 << 3);
  uVar10 = local_70;
  if ((uint)local_68 != 0) {
    *local_60 = &zeroobj;
  }
  uVar16 = (uint)((uint)local_68 != 0);
  iVar9 = (int)local_70;
  if (olist != (obj *)0x0) {
    uVar13 = local_70 & 8;
    local_50 = flags.inv_order;
    do {
      if (((((local_70 & 0x40) != 0) && (olist->otyp == 0x10e)) &&
          (bVar3 = will_feel_cockatrice(olist,'\0'), bVar3 != '\0')) &&
         (u.uprops[0x21].intrinsic == 0)) {
        free(local_60);
        look_here(0,'\0');
        return 0;
      }
      if (((uVar13 == 0) || (pcVar6 = strchr(local_50,(int)olist->oclass), pcVar6 != (char *)0x0))
         && (bVar3 = (*allow)(olist), bVar3 != '\0')) {
        lVar7 = (long)(int)uVar16;
        uVar16 = uVar16 + 1;
        local_60[lVar7] = olist;
      }
      olist = *(obj **)((long)olist->oextra + ((ulong)(iVar9 * 8 & 8) - 100));
    } while (olist != (obj *)0x0);
  }
  if ((uVar10 & 8) != 0) {
    uVar5 = (uVar16 - 1) + (uint)((uint)local_68 == 0);
    if (0 < (int)uVar5) {
      if ((local_70 & 4) == 0) {
        __compar = obj_compare;
      }
      else {
        __compar = invo_obj_compare;
      }
      qsort((void *)((long)local_60 + (ulong)((uint)local_68 >> 4)),(ulong)uVar5,8,__compar);
    }
  }
  nr_items = uVar16;
  local_58 = (nh_objitem *)malloc((long)(int)uVar16 * 0x124);
  uVar12 = 0;
  uVar5 = 0;
  if ((uint)local_68 != 0) {
    bVar18 = (uVar10 & 8) != 0;
    if (bVar18) {
      add_objitem(&local_58,&nr_items,MI_HEADING,0,0,"Furniture",(obj *)0x0,'\0');
    }
    uVar5 = bVar18 + 1;
    uVar12 = 1;
    add_objitem(&local_58,&nr_items,MI_NORMAL,(uint)bVar18,1,"a magic chest",&zeroobj,'\0');
  }
  if ((int)uVar12 < (int)uVar16) {
    local_50 = (char *)(CONCAT44(local_50._4_4_,iVar9) & 0xffffffff00000008);
    uVar10 = local_70 & 0xffffffff;
    uVar13 = (ulong)uVar12;
    local_68 = (ulong)uVar16;
    cVar4 = -1;
    do {
      poVar17 = (obj *)local_60[uVar13];
      uVar16 = uVar5;
      if (((int)local_50 != 0) && (cVar4 != poVar17->oclass)) {
        uVar16 = uVar5 + 1;
        pcVar6 = let_to_name(poVar17->oclass,'\0');
        add_objitem(&local_58,&nr_items,MI_HEADING,uVar5,0,pcVar6,poVar17,'\0');
      }
      examine_object(poVar17);
      uVar5 = uVar16 + 1;
      uVar13 = uVar13 + 1;
      pcVar6 = doname(poVar17);
      add_objitem(&local_58,&nr_items,MI_NORMAL,uVar16,(int)uVar13,pcVar6,poVar17,
                  (byte)(uVar10 >> 2) & 1);
      cVar4 = poVar17->oclass;
    } while (local_68 != uVar13);
  }
  if ((int)uVar5 < 1) {
    pick_list_00 = (nh_objresult *)0x0;
  }
  else {
    pick_list_00 = (nh_objresult *)malloc((ulong)uVar5 << 3);
    uVar11 = display_objects(local_58,uVar5,local_38,local_44,pick_list_00);
  }
  __ptr = local_60;
  if ((int)uVar11 < 1) {
    bVar18 = (int)uVar11 < 0;
    uVar11 = 0;
    if (bVar18) {
      uVar11 = ((int)local_70 << 0x1a) >> 0x1f & 0xfffffffe;
    }
  }
  else {
    poVar8 = (object_pick *)malloc((ulong)uVar11 << 4);
    *local_40 = poVar8;
    lVar7 = 0;
    do {
      lVar2 = __ptr[(long)*(int *)((long)&pick_list_00->id + lVar7) + -1];
      *(long *)((long)&poVar8->obj + lVar7 * 2) = lVar2;
      iVar9 = *(int *)((long)&pick_list_00->count + lVar7);
      iVar1 = *(int *)(lVar2 + 0x30);
      iVar14 = iVar1;
      if (iVar9 < iVar1) {
        iVar14 = iVar9;
      }
      if (iVar9 == -1) {
        iVar14 = iVar1;
      }
      poVar8 = *local_40;
      *(int *)((long)&poVar8->count + lVar7 * 2) = iVar14;
      lVar7 = lVar7 + 8;
    } while ((ulong)uVar11 << 3 != lVar7);
  }
  free(pick_list_00);
  free(__ptr);
  free(local_58);
  return uVar11;
}

Assistant:

int query_objlist(const char *qstr,	/* query string */
		  struct obj *olist,	/* the list to pick from */
		  int qflags,		/* options to control the query */
		  struct object_pick **pick_list,/* return list of items picked */
		  int how,		/* type of query */
		  boolean (*allow)(const struct obj*)) /* allow function */
{
	int n = 0, i, prev_oclass, nr_objects;
	struct obj *curr, *last;
	int nr_items = 0, cur_entry = 0;
	struct nh_objitem *items = NULL;
	struct obj **objlist = NULL;
	struct nh_objresult *selection = NULL;

	*pick_list = NULL;

	/* count the number of items allowed */
	n = 0;
	last = 0;
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* &zeroobj indicates the selection of the 'magic chest' entry */
	    last = &zeroobj;
	    n++;
	}
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((*allow)(curr)) {
		last = curr;
		n++;
	    }
	}

	if (n == 0)	/* nothing to pick here */
	    return (qflags & SIGNAL_NOMENU) ? -1 : 0;

	if (n == 1 && (qflags & AUTOSELECT_SINGLE)) {
	    *pick_list = malloc(sizeof(struct object_pick));
	    (*pick_list)->obj = last;
	    /* For a magic chest, use a valid but arbitrary count. */
	    (*pick_list)->count = cobj_is_magic_chest(last) ? 1 : last->quan;
	    return 1;
	}

	/* add all allowed objects to the list */
	nr_objects = 0;
	objlist = malloc(n * sizeof(struct obj*));
	if (qflags & SHOW_MAGIC_CHEST)
	    objlist[nr_objects++] = &zeroobj;
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((qflags & FEEL_COCKATRICE) && curr->otyp == CORPSE &&
		    will_feel_cockatrice(curr, FALSE) && !Stoned) {
		    free(objlist);
		    look_here(0, FALSE);
		    return 0;
	    }
	    if ((!(qflags & INVORDER_SORT) || strchr(flags.inv_order, curr->oclass))
		&& (*allow)(curr))
		objlist[nr_objects++] = curr;
	}

	/* sort the list in place according to (1) inv_order and... */
	if (qflags & INVORDER_SORT) {
	    struct obj **tmp_objlist = objlist;
	    int tmp_nr_objects = nr_objects;
	    int (*objcmp_func)(const void *, const void *) =
		(qflags & USE_INVLET) ?
		    invo_obj_compare :	/* ... (2) only inv_order. */
		    obj_compare;	/* ... (2) object name. */
	    if (qflags & SHOW_MAGIC_CHEST) {
		/* Don't move 'magic chest' entry away from the top. */
		tmp_objlist++;
		tmp_nr_objects--;
	    }
	    if (tmp_nr_objects > 0)
		qsort(tmp_objlist, tmp_nr_objects, sizeof(struct obj *), objcmp_func);
	}

	/* nr_items will be greater than nr_objects, because it counts headers, too */
	nr_items = nr_objects;
	items = malloc(nr_items * sizeof(struct nh_objitem));
	prev_oclass = -1;
	cur_entry = 0;
	i = 0;
	/* magic chest comes first if it was requested */
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* fudge the entries for 'magic chest' */
	    if (qflags & INVORDER_SORT) {
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
			    "Furniture", NULL, FALSE);
	    }
	    /* &zeroobj is handled specially by add_objitem */
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
			"a magic chest", &zeroobj, FALSE);
	    i++;
	}
	/* now go through the objects proper */
	for (; i < nr_objects; i++) {
	    curr = objlist[i];
	    /* if sorting, print type name */
	    if ((qflags & INVORDER_SORT) && prev_oclass != curr->oclass)
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
		            let_to_name(curr->oclass, FALSE), curr, FALSE);
	    /* add the object to the list */
	    examine_object(curr);
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
	                doname(curr), curr, (qflags & USE_INVLET) != 0);
	    prev_oclass = curr->oclass;
	}

	if (cur_entry > 0) {
	    selection = malloc(cur_entry * sizeof(struct nh_objresult));
	    n = display_objects(items, cur_entry, qstr, how, selection);
	}

	if (n > 0) {
	    *pick_list = malloc(n * sizeof(struct object_pick));

	    for (i = 0; i < n; i++) {
		curr = objlist[selection[i].id - 1];
		(*pick_list)[i].obj = curr;
		if (selection[i].count == -1 || selection[i].count > curr->quan)
		    (*pick_list)[i].count = curr->quan;
		else
		    (*pick_list)[i].count = selection[i].count;
	    }
	} else if (n < 0) {
	    /* callers don't expect -1 by this point */
	    n = (qflags & SIGNAL_ESCAPE) ? -2 : 0;
	}
	free(selection);
	free(objlist);
	free(items);

	return n;
}